

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupZero(Gia_Man_t *p)

{
  Gia_Man_t *p_00;
  char *pcVar1;
  int iVar2;
  
  p_00 = Gia_ManStart(p->vCis->nSize + p->vCos->nSize + 1);
  pcVar1 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar1;
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    Gia_ManAppendCi(p_00);
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    Gia_ManAppendCo(p_00,0);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupZero( Gia_Man_t * p )
{
    Gia_Man_t * pNew; int i;
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}